

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopClipRect(void)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  ImDrawList::PopClipRect(pIVar2->DrawList);
  pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data +
           (long)(pIVar2->DrawList->_ClipRectStack).Size + -1;
  fVar3 = pIVar1->y;
  fVar4 = pIVar1->z;
  fVar5 = pIVar1->w;
  (pIVar2->ClipRect).Min.x = pIVar1->x;
  (pIVar2->ClipRect).Min.y = fVar3;
  (pIVar2->ClipRect).Max.x = fVar4;
  (pIVar2->ClipRect).Max.y = fVar5;
  return;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = toupper(*str2) - toupper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}